

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmCommonTargetGenerator::GetLinkedTargetDirectories_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmCommonTargetGenerator *this)

{
  bool bVar1;
  TargetType TVar2;
  cmComputeLinkInformation *this_00;
  ItemVector *this_01;
  string *psVar3;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar4;
  byte local_129;
  string local_100 [32];
  undefined1 local_e0 [8];
  string di;
  cmLocalGenerator *lg;
  cmGeneratorTarget *local_98;
  cmGeneratorTarget *linkee;
  Item *item;
  const_iterator __end2;
  const_iterator __begin2;
  ItemVector *__range2;
  ItemVector *items;
  cmComputeLinkInformation *cli;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  emitted;
  cmCommonTargetGenerator *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dirs;
  
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
         *)&cli);
  this_00 = cmGeneratorTarget::GetLinkInformation(this->GeneratorTarget,&this->ConfigName);
  if (this_00 != (cmComputeLinkInformation *)0x0) {
    this_01 = cmComputeLinkInformation::GetItems(this_00);
    __end2 = std::
             vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
             ::begin(this_01);
    item = (Item *)std::
                   vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                   ::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                                       *)&item), bVar1) {
      linkee = (cmGeneratorTarget *)
               __gnu_cxx::
               __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
               ::operator*(&__end2);
      local_98 = (cmGeneratorTarget *)(linkee->ObjectDirectory)._M_string_length;
      local_129 = 0;
      if (local_98 != (cmGeneratorTarget *)0x0) {
        bVar1 = cmGeneratorTarget::IsImported(local_98);
        local_129 = 0;
        if (!bVar1) {
          TVar2 = cmGeneratorTarget::GetType(local_98);
          local_129 = 0;
          if (TVar2 != INTERFACE_LIBRARY) {
            pVar4 = std::
                    set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                    ::insert((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                              *)&cli,&local_98);
            local_129 = pVar4.second;
          }
        }
      }
      if ((local_129 & 1) != 0) {
        di.field_2._8_8_ = cmGeneratorTarget::GetLocalGenerator(local_98);
        psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                           ((cmLocalGenerator *)di.field_2._8_8_);
        std::__cxx11::string::string((string *)local_e0,(string *)psVar3);
        std::__cxx11::string::operator+=((string *)local_e0,"/");
        (**(code **)(*(long *)di.field_2._8_8_ + 0x60))(local_100,di.field_2._8_8_,local_98);
        std::__cxx11::string::operator+=((string *)local_e0,local_100);
        std::__cxx11::string::~string(local_100);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)local_e0);
        std::__cxx11::string::~string((string *)local_e0);
      }
      __gnu_cxx::
      __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
      ::operator++(&__end2);
    }
  }
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *)&cli);
  if ((emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmCommonTargetGenerator::GetLinkedTargetDirectories()
  const
{
  std::vector<std::string> dirs;
  std::set<cmGeneratorTarget const*> emitted;
  if (cmComputeLinkInformation* cli =
        this->GeneratorTarget->GetLinkInformation(this->ConfigName)) {
    cmComputeLinkInformation::ItemVector const& items = cli->GetItems();
    for (auto const& item : items) {
      cmGeneratorTarget const* linkee = item.Target;
      if (linkee &&
          !linkee->IsImported()
          // We can ignore the INTERFACE_LIBRARY items because
          // Target->GetLinkInformation already processed their
          // link interface and they don't have any output themselves.
          && linkee->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
          emitted.insert(linkee).second) {
        cmLocalGenerator* lg = linkee->GetLocalGenerator();
        std::string di = lg->GetCurrentBinaryDirectory();
        di += "/";
        di += lg->GetTargetDirectory(linkee);
        dirs.push_back(std::move(di));
      }
    }
  }
  return dirs;
}